

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::add_child_generator(Generator *this,string *instance_name_,Generator *child)

{
  enable_shared_from_this<kratos::Generator> local_30;
  Generator *local_20;
  Generator *child_local;
  string *instance_name__local;
  Generator *this_local;
  
  local_20 = child;
  child_local = (Generator *)instance_name_;
  instance_name__local = (string *)this;
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_30);
  add_child_generator(this,instance_name_,(shared_ptr<kratos::Generator> *)&local_30);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_30);
  return;
}

Assistant:

void Generator::add_child_generator(const std::string &instance_name_, Generator &child) {
    add_child_generator(instance_name_, child.shared_from_this());
}